

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O0

void __thiscall Disk::resize(Disk *this,int new_cyls,int new_heads)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  CylHead local_40;
  _Base_ptr local_38;
  _Base_ptr local_30;
  _Self local_28;
  _Self local_20;
  iterator it;
  int new_heads_local;
  int new_cyls_local;
  Disk *this_local;
  
  it._M_node._0_4_ = new_heads;
  it._M_node._4_4_ = new_cyls;
  if ((new_cyls == 0) && (new_heads == 0)) {
    std::
    map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
    ::clear(&this->m_trackdata);
  }
  else {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
         ::begin(&this->m_trackdata);
    while( true ) {
      local_28._M_node =
           (_Base_ptr)
           std::
           map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
           ::end(&this->m_trackdata);
      bVar1 = std::operator!=(&local_20,&local_28);
      if (!bVar1) break;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_CylHead,_TrackData>_>::operator->(&local_20);
      if (((ppVar3->first).cyl < it._M_node._4_4_) &&
         (ppVar3 = std::_Rb_tree_iterator<std::pair<const_CylHead,_TrackData>_>::operator->
                             (&local_20), (ppVar3->first).head < (int)it._M_node)) {
        std::_Rb_tree_iterator<std::pair<const_CylHead,_TrackData>_>::operator++(&local_20);
      }
      else {
        local_38 = local_20._M_node;
        local_30 = (_Base_ptr)
                   std::
                   map<CylHead,TrackData,std::less<CylHead>,std::allocator<std::pair<CylHead_const,TrackData>>>
                   ::erase_abi_cxx11_((map<CylHead,TrackData,std::less<CylHead>,std::allocator<std::pair<CylHead_const,TrackData>>>
                                       *)&this->m_trackdata,local_20._M_node);
        local_20._M_node = local_30;
      }
    }
    iVar2 = cyls(this);
    if ((iVar2 < it._M_node._4_4_) || (iVar2 = heads(this), iVar2 < (int)it._M_node)) {
      CylHead::CylHead(&local_40,it._M_node._4_4_ + -1,(int)it._M_node + -1);
      std::
      map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
      ::operator[](&this->m_trackdata,&local_40);
    }
  }
  return;
}

Assistant:

void Disk::resize(int new_cyls, int new_heads)
{
    if (!new_cyls && !new_heads)
    {
        m_trackdata.clear();
        return;
    }

    // Remove tracks beyond the new extent
    for (auto it = m_trackdata.begin(); it != m_trackdata.end(); )
    {
        if (it->first.cyl >= new_cyls || it->first.head >= new_heads)
            it = m_trackdata.erase(it);
        else
            ++it;
    }

    // If the disk is too small, insert a blank track to extend it
    if (cyls() < new_cyls || heads() < new_heads)
        m_trackdata[CylHead(new_cyls - 1, new_heads - 1)];
}